

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzfmatrix.cpp
# Opt level: O1

TPZFMatrix<long> * __thiscall TPZFMatrix<long>::operator=(TPZFMatrix<long> *this,long value)

{
  long *plVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  long lVar4;
  long lVar5;
  ulong uVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  
  auVar3 = _DAT_014f8350;
  auVar2 = _DAT_014f8340;
  lVar4 = (this->super_TPZMatrix<long>).super_TPZBaseMatrix.fCol *
          (this->super_TPZMatrix<long>).super_TPZBaseMatrix.fRow;
  if (0 < lVar4) {
    plVar1 = this->fElem;
    lVar5 = lVar4 + -1;
    auVar7._8_4_ = (int)lVar5;
    auVar7._0_8_ = lVar5;
    auVar7._12_4_ = (int)((ulong)lVar5 >> 0x20);
    uVar6 = 0;
    auVar7 = auVar7 ^ _DAT_014f8350;
    do {
      auVar8._8_4_ = (int)uVar6;
      auVar8._0_8_ = uVar6;
      auVar8._12_4_ = (int)(uVar6 >> 0x20);
      auVar8 = (auVar8 | auVar2) ^ auVar3;
      if ((bool)(~(auVar8._4_4_ == auVar7._4_4_ && auVar7._0_4_ < auVar8._0_4_ ||
                  auVar7._4_4_ < auVar8._4_4_) & 1)) {
        plVar1[uVar6] = value;
      }
      if ((auVar8._12_4_ != auVar7._12_4_ || auVar8._8_4_ <= auVar7._8_4_) &&
          auVar8._12_4_ <= auVar7._12_4_) {
        plVar1[uVar6 + 1] = value;
      }
      uVar6 = uVar6 + 2;
    } while ((lVar4 + 1U & 0xfffffffffffffffe) != uVar6);
  }
  (this->super_TPZMatrix<long>).super_TPZBaseMatrix.fDecomposed = '\0';
  return this;
}

Assistant:

TPZFMatrix<TVar>& TPZFMatrix<TVar>::operator=(const TVar value ) {
    int64_t size = ((int64_t)this->fRow) * this->fCol;
    TVar * dst   = fElem;
    for ( int64_t i = 0; i < size; i++ )
        *dst++ = value;
    this->fDecomposed = 0;
    return *this;
}